

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint_t __thiscall shm_test::ClientReaderThread::threadFunc(ClientReaderThread *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint_t uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count = 0;
  buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = (char *)0x0;
  buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_hdr = (Hdr *)0x0;
  uVar5 = 0;
  iVar3 = 0;
  do {
    if (0x3ffffff < uVar5) {
      uVar2 = 0;
      printf("\nReading 100%% (done), %zd bytes\n",uVar5);
LAB_0011aaa8:
      axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
                (&buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
      return uVar2;
    }
    iVar1 = (**this->m_transport->_vptr_Transport)(this->m_transport,&buffer);
    uVar4 = CONCAT44(extraout_var,iVar1);
    if (uVar4 == 0xffffffffffffffff) {
      axl::err::getLastErrorDescription();
      if (local_50.m_length == 0) {
        local_50.m_p = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      printf("client: read error: %s\n",local_50.m_p);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_50);
LAB_0011aaa5:
      uVar2 = 0xffffffff;
      goto LAB_0011aaa8;
    }
    if (uVar4 < 8) {
      puts("client: buffer too small");
      goto LAB_0011aaa5;
    }
    if ((*(int *)buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p != 1) ||
       ((ulong)*(uint *)(buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p + 4) + 8 !=
        uVar4)) {
      printf("client: invalid reply: %d (%d)\n");
      goto LAB_0011aaa5;
    }
    uVar5 = uVar5 + *(uint *)(buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p + 4);
    uVar4 = uVar5 * 100 >> 0x1a;
    iVar1 = (int)uVar4;
    if (iVar3 != iVar1) {
      printf("\b\b\b\b%d%%",uVar4 & 0xffffffff);
      iVar3 = iVar1;
    }
  } while( true );
}

Assistant:

uint_t
	threadFunc() {
		ASSERT(m_transport);

		int percentage = 0;
		size_t totalSize = 0;

		sl::Array<char> buffer;

		while (totalSize < TotalSize) {
			size_t receivedSize = m_transport->readMessage(&buffer);
			if (receivedSize == -1) {
				printf("client: read error: %s\n", err::getLastErrorDescription().sz());
				return -1;
			}

			if (receivedSize < sizeof(ReqHdr)) {
				printf("client: buffer too small\n");
				return -1;
			}

			ReqHdr* reply = (ReqHdr*)buffer.cp();
			if (reply->m_code != ReqCode_Reply || sizeof(ReqHdr) + reply->m_size != receivedSize) {
				printf("client: invalid reply: %d (%d)\n", reply->m_code, reply->m_size);
				return -1;
			}

			totalSize += reply->m_size;

			int newPercentage = (uint64_t)totalSize * 100 / TotalSize;
			if (newPercentage != percentage) {
				percentage = newPercentage;
				printf("\b\b\b\b%d%%", percentage);
			}
		}

		printf("\nReading 100%% (done), %zd bytes\n", totalSize);
		return 0;
	}